

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

bool __thiscall asl::HttpMessage::sendHeaders(HttpMessage *this)

{
  Socket *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  String *pSVar5;
  EnumWrapper<const_asl::Dic<asl::String>_> *pEVar6;
  String *x;
  String *pSVar7;
  char *pcVar8;
  ssize_t sVar9;
  HttpStatus *pHVar10;
  ulong in_RCX;
  size_t __n;
  Dic<asl::String> *e;
  int local_138;
  String local_a8;
  undefined1 local_90 [8];
  String contentlength;
  int sent;
  String *name;
  String *value;
  EnumWrapper_ *local_48;
  EnumWrapper_ *_b_;
  undefined1 local_30 [8];
  String s;
  HttpMessage *this_local;
  
  s.field_2._8_8_ = this;
  asl::String::String((String *)local_30);
  pSVar5 = asl::String::operator<<((String *)local_30,&this->_command);
  asl::String::operator<<(pSVar5,"\r\n");
  newEnumerator<asl::Dic<asl::String>>
            ((EnumWrapper<asl::Dic<asl::String>_> *)&value,(asl *)&this->_headers,e);
  local_48 = (EnumWrapper_ *)&value;
  while( true ) {
    pEVar6 = enumData<asl::Dic<asl::String>const>((Dic<asl::String> *)0x0,local_48);
    bVar1 = EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar6);
    __n = CONCAT71((int7)(in_RCX >> 8),bVar1);
    bVar2 = false;
    if (bVar1) {
      bVar2 = local_48->more != 0;
    }
    if (!bVar2) break;
    pEVar6 = enumData<asl::Dic<asl::String>const>((Dic<asl::String> *)0x0,local_48);
    pSVar5 = Map<asl::String,_asl::String>::Enumerator::operator*((Enumerator *)(pEVar6 + 8));
    while (0 < local_48->more) {
      pEVar6 = enumData<asl::Dic<asl::String>const>((Dic<asl::String> *)0x0,local_48);
      x = Map<asl::String,_asl::String>::Enumerator::operator~((Enumerator *)(pEVar6 + 8));
      while (local_48->more != 0) {
        pSVar7 = asl::String::operator<<((String *)local_30,x);
        pSVar7 = asl::String::operator<<(pSVar7,": ");
        pSVar7 = asl::String::operator<<(pSVar7,pSVar5);
        asl::String::operator<<(pSVar7,"\r\n");
        local_48->more = local_48->more + -1;
      }
      local_48->more = local_48->more + -2;
    }
    pEVar6 = enumData<asl::Dic<asl::String>const>((Dic<asl::String> *)0x0,local_48);
    Map<asl::String,_asl::String>::Enumerator::operator++((Enumerator *)(pEVar6 + 8));
    uVar3 = -local_48->more - 1;
    in_RCX = (ulong)uVar3;
    local_48->more = uVar3;
  }
  asl::String::operator<<((String *)local_30,"\r\n");
  this_00 = this->_socket;
  pcVar8 = asl::String::operator*((String *)local_30);
  uVar3 = asl::String::length((String *)local_30);
  sVar9 = Socket::write(this_00,(int)pcVar8,(void *)(ulong)uVar3,__n);
  contentlength.field_2._12_4_ = (int)sVar9;
  iVar4 = asl::String::length((String *)local_30);
  if ((int)sVar9 < iVar4) {
    this_local._7_1_ = false;
    contentlength.field_2._8_4_ = 1;
  }
  else {
    this->_headersSent = true;
    asl::String::String(&local_a8,"Content-Length");
    header((String *)local_90,this,&local_a8);
    asl::String::~String(&local_a8);
    bVar2 = asl::String::ok((String *)local_90);
    this->_chunked = (bool)((bVar2 ^ 0xffU) & 1);
    if ((this->_chunked & 1U) == 0) {
      local_138 = asl::String::operator_cast_to_int((String *)local_90);
    }
    else {
      local_138 = 0;
    }
    pHVar10 = Shared<asl::HttpStatus>::operator->(&this->_status);
    pHVar10->totalSend = local_138;
    this_local._7_1_ = true;
    contentlength.field_2._8_4_ = 1;
    asl::String::~String((String *)local_90);
  }
  asl::String::~String((String *)local_30);
  return this_local._7_1_;
}

Assistant:

bool HttpMessage::sendHeaders()
{
	String s;
	s << _command << "\r\n";
	foreach2(String& name, String& value, _headers)
	{
		s << name << ": " << value << "\r\n";
	}
	s << "\r\n";
	int sent = _socket->write(*s, s.length());
	if (sent < s.length())
		return false;
	_headersSent = true;
	String contentlength = header("Content-Length");
	_chunked = !contentlength.ok();
	_status->totalSend = _chunked ? 0 : int(contentlength);
	return true;
}